

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall IR::IRBuilder::move(IRBuilder *this,Temp *target,Temp *source)

{
  bool bVar1;
  Temp *local_20;
  Temp *local_18;
  _Fwd_list_node_base *local_10;
  
  local_20 = source;
  local_18 = target;
  bVar1 = BasicBlock::isTerminated(this->block_);
  if (!bVar1) {
    std::forward_list<IR::Move,std::allocator<IR::Move>>::
    emplace_front<IR::Temp_const*&,IR::Temp_const*&>
              ((forward_list<IR::Move,std::allocator<IR::Move>> *)&this->function_->moves_,&local_18
               ,&local_20);
    local_10 = (this->function_->moves_).super__Fwd_list_base<IR::Move,_std::allocator<IR::Move>_>.
               _M_impl._M_head._M_next + 1;
    std::vector<IR::Stmt*,std::allocator<IR::Stmt*>>::emplace_back<IR::Stmt*>
              ((vector<IR::Stmt*,std::allocator<IR::Stmt*>> *)this->block_,(Stmt **)&local_10);
  }
  return;
}

Assistant:

void IRBuilder::move(const Temp* target, const Temp* source) {
  if (block_->isTerminated()) return;
  function_->moves_.emplace_front(target, source);
  block_->push_back(&function_->moves_.front());
}